

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O2

void __thiscall
cs::allocator_type<cs_impl::any::holder<cs::pointer>,_64UL,_cs_impl::default_allocator_provider>::
allocator_type(allocator_type<cs_impl::any::holder<cs::pointer>,_64UL,_cs_impl::default_allocator_provider>
               *this)

{
  size_t sVar1;
  holder<cs::pointer> *phVar2;
  ulong uVar3;
  
  this->mOffset = 0;
  uVar3 = 0;
  while (uVar3 < 0x20) {
    phVar2 = (holder<cs::pointer> *)operator_new(0x10);
    sVar1 = this->mOffset;
    uVar3 = sVar1 + 1;
    this->mOffset = uVar3;
    this->mPool[sVar1] = phVar2;
  }
  return;
}

Assistant:

allocator_type()
		{
			while (mOffset < 0.5 * blck_size)
				mPool[mOffset++] = mAlloc.allocate(1);
		}